

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O1

bool __thiscall
icu_63::number::impl::DecimalQuantity::adjustMagnitude(DecimalQuantity *this,int32_t delta)

{
  UBool UVar1;
  UBool UVar2;
  bool bVar3;
  int32_t dummy;
  int32_t local_1c;
  
  if (this->precision != 0) {
    UVar1 = uprv_add32_overflow_63(this->scale,delta,&this->scale);
    UVar2 = uprv_add32_overflow_63(this->origDelta,delta,&this->origDelta);
    bVar3 = true;
    if (UVar2 == '\0' && UVar1 == '\0') {
      UVar1 = uprv_add32_overflow_63(this->scale,this->precision,&local_1c);
      bVar3 = UVar1 != '\0';
    }
    return bVar3;
  }
  return false;
}

Assistant:

bool DecimalQuantity::adjustMagnitude(int32_t delta) {
    if (precision != 0) {
        // i.e., scale += delta; origDelta += delta
        bool overflow = uprv_add32_overflow(scale, delta, &scale);
        overflow = uprv_add32_overflow(origDelta, delta, &origDelta) || overflow;
        // Make sure that precision + scale won't overflow, either
        int32_t dummy;
        overflow = overflow || uprv_add32_overflow(scale, precision, &dummy);
        return overflow;
    }
    return false;
}